

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int internal_write_event
              (CMConnection conn,CMFormat format,void *remote_path_id,int path_len,event_item *event
              ,attr_list attrs,size_t *event_len_p)

{
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  pthread_t pVar4;
  undefined8 uVar5;
  long lVar6;
  int in_ECX;
  uint *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  size_t *in_stack_00000008;
  timespec ts_7;
  timespec ts_6;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  FFSEncodeVector assign_vec;
  int header [4];
  size_t byte_count;
  FFSEncodeVector tmp_vec;
  FFSEncodeVec static_vec [100];
  timespec ts_2;
  char *size_str;
  int r;
  timespec ts_1;
  timespec ts;
  CManager_conflict cm;
  int attrs_present;
  void *encoded_attrs;
  int do_write;
  int attr_len;
  long vec_count;
  size_t actual;
  size_t data_length;
  FFSEncodeVec preencoded_vec [2];
  FFSEncodeVector vec;
  size_t in_stack_fffffffffffff7c0;
  attr_list in_stack_fffffffffffff7c8;
  FILE *pFVar7;
  CMFormat in_stack_fffffffffffff7d0;
  CMFormat in_stack_fffffffffffff7d8;
  CMConnection in_stack_fffffffffffff7e0;
  FFSEncodeVector in_stack_fffffffffffff7e8;
  CMConnection in_stack_fffffffffffff7f0;
  undefined8 in_stack_fffffffffffff7f8;
  CMTraceType trace_type;
  CManager in_stack_fffffffffffff800;
  CMConnection in_stack_fffffffffffff810;
  CMConnection in_stack_fffffffffffff850;
  timespec local_7a0;
  timespec local_790;
  timespec local_780;
  timespec local_770;
  timespec local_760;
  long *local_750;
  undefined8 local_748;
  undefined8 local_740;
  size_t local_738;
  long *local_730;
  long local_728 [201];
  timespec local_e0;
  char *local_d0;
  int local_c4;
  timespec local_c0;
  timespec local_b0;
  long local_a0;
  int local_94;
  long local_90;
  int local_88;
  uint local_84;
  ulong local_80;
  long local_78;
  size_t local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 *local_40;
  long local_38;
  long local_30;
  int local_24;
  uint *local_20;
  long local_18;
  long *local_10;
  
  trace_type = (CMTraceType)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  local_70 = 0;
  local_80 = 0;
  local_84 = 0;
  local_88 = 1;
  local_90 = 0;
  local_94 = 0;
  local_a0 = *in_RDI;
  local_10 = in_RDI;
  if ((int)in_RDI[5] == 0) {
    if (*(int *)((long)in_RDI + 0x2c) == 0) {
      local_38 = in_R9;
      local_30 = in_R8;
      local_24 = in_ECX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      if ((int)in_RDI[0x24] != 0) {
        wait_for_pending_write(in_stack_fffffffffffff850);
      }
      if (*(int *)(local_18 + 0x40) != 0) {
        CMcomplete_format_registration
                  (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20));
      }
      if (*(long *)(local_18 + 0x10) == 0) {
        printf("Format registration has failed for format \"%s\" - write aborted\n",
               *(undefined8 *)(local_18 + 8));
        return 0;
      }
      CMformat_preload(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
      iVar1 = CMtrace_val[4];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
      }
      if (iVar1 != 0) {
        if (internal_write_event::size_set == 0) {
          local_d0 = getenv("CMDumpSize");
          internal_write_event::size_set = internal_write_event::size_set + 1;
          if (local_d0 != (char *)0x0) {
            internal_write_event::dump_char_limit = atoi(local_d0);
          }
        }
        lVar6 = local_30;
        pFVar7 = *(FILE **)(local_a0 + 0x120);
        uVar5 = name_of_FMformat(*(undefined8 *)(local_18 + 0x10));
        fprintf(pFVar7,"CM - Writing EVENT record %p of type %s\n",lVar6,uVar5);
        if (local_38 == 0) {
          fprintf(*(FILE **)(local_a0 + 0x120),"CM - write attrs NULL\n");
        }
        else {
          fprintf(*(FILE **)(local_a0 + 0x120),"CM - write attributes are:");
          fdump_attr_list(*(undefined8 *)(local_a0 + 0x120),local_38);
        }
        pFVar7 = *(FILE **)(local_a0 + 0x120);
        uVar5 = name_of_FMformat(*(undefined8 *)(local_18 + 0x10));
        fprintf(pFVar7,"CM - record type %s, contents ",uVar5);
        if (*(long *)(local_30 + 0x20) == 0) {
          fprintf(*(FILE **)(local_a0 + 0x120),"ENCODED are:\n  ");
          local_c4 = FMfdump_encoded_data
                               (*(undefined8 *)(local_a0 + 0x120),*(undefined8 *)(local_18 + 0x10),
                                *(undefined8 *)(local_30 + 0x10),
                                internal_write_event::dump_char_limit);
        }
        else {
          fprintf(*(FILE **)(local_a0 + 0x120),"DECODED are:\n  ");
          local_c4 = FMfdump_data(*(undefined8 *)(local_a0 + 0x120),*(undefined8 *)(local_18 + 0x10)
                                  ,*(undefined8 *)(local_30 + 0x20),
                                  internal_write_event::dump_char_limit);
        }
        if ((local_c4 == 0) && (internal_write_event::warned == 0)) {
          fprintf(*(FILE **)(local_a0 + 0x120),"\n\n  ****  Warning **** CM record dump truncated\n"
                 );
          fprintf(*(FILE **)(local_a0 + 0x120),
                  "  To change size limits, set CMDumpSize environment variable.\n");
          internal_write_event::warned = internal_write_event::warned + 1;
        }
        fprintf(*(FILE **)(local_a0 + 0x120),"\n=======\n");
      }
      if (*(long *)(local_30 + 0x10) == 0) {
        local_40 = (undefined8 *)
                   FFSencode_vector(local_10[4],*(undefined8 *)(local_18 + 0x10),
                                    *(undefined8 *)(local_30 + 0x20));
        for (; local_40[local_80 * 2] != 0; local_80 = local_80 + 1) {
          local_70 = local_40[local_80 * 2 + 1] + local_70;
        }
      }
      else {
        local_40 = &local_68;
        local_68 = *(undefined8 *)(local_30 + 0x10);
        local_60 = *(undefined8 *)(local_30 + 0x18);
        local_58 = 0;
        local_50 = 0;
        local_80 = 1;
        local_70 = *(size_t *)(local_30 + 0x18);
      }
      if (local_38 != 0) {
        local_94 = local_94 + 1;
        local_90 = encode_attr_for_xmit(local_38,local_10[0xc],&local_84);
        local_84 = local_84 + 7 & 0xfffffff8;
      }
      iVar1 = CMtrace_val[4];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)(*local_10 + 0x120);
          _Var2 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_e0);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_e0.tv_sec,local_e0.tv_nsec);
        }
        fprintf(*(FILE **)(*local_10 + 0x120),
                "CM - Total write size is %zd bytes data + %d bytes attrs\n",local_70,
                (ulong)local_84);
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      if (cm_write_hook != (_func_int_size_t *)0x0) {
        local_88 = (*cm_write_hook)(local_70);
      }
      if (local_88 != 0) {
        local_730 = local_728;
        local_738 = local_70;
        local_748 = 0x434d4c00;
        local_740 = 0;
        if (99 < local_80) {
          local_730 = (long *)INT_CMmalloc(in_stack_fffffffffffff7c0);
        }
        local_748._4_4_ = (undefined4)local_70;
        if (local_24 == 4) {
          local_748 = CONCAT44(local_748._4_4_,0x434d4c00);
          uVar3 = *local_20;
        }
        else {
          local_748 = CONCAT44(local_748._4_4_,0x434d4700);
          uVar3 = local_24 + 7U & 0xfffffff8;
        }
        if (local_38 == 0) {
          local_750 = local_730;
          local_740 = (ulong)uVar3 << 0x20;
          if (local_24 != 4) {
            local_730[2] = (long)local_20;
            local_730[3] = (long)(int)(local_24 + 7U & 0xfffffff8);
            local_738 = local_730[3] + local_738;
            local_750 = local_730 + 2;
          }
          *local_730 = (long)&local_748;
          local_730[1] = 0x10;
          memcpy(local_750 + 2,local_40,local_80 << 4);
          local_80 = local_80 + 1;
          local_738 = local_738 + 0x10;
          iVar1 = CMtrace_val[3];
          if (*(long *)(*local_10 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              pFVar7 = *(FILE **)(*local_10 + 0x120);
              _Var2 = getpid();
              in_stack_fffffffffffff810 = (CMConnection)(long)_Var2;
              pVar4 = pthread_self();
              fprintf(pFVar7,"P%lxT%lx - ",in_stack_fffffffffffff810,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_760);
              fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_760.tv_sec,
                      local_760.tv_nsec);
            }
            fprintf(*(FILE **)(*local_10 + 0x120),"Writing %lu vectors, total %zu bytes in writev\n"
                    ,local_80,local_738);
          }
          fflush(*(FILE **)(*local_10 + 0x120));
        }
        else {
          *local_730 = (long)&local_748;
          local_730[1] = 0x10;
          local_730[2] = local_90;
          local_740 = CONCAT44(uVar3,local_84);
          local_730[3] = (long)(int)local_84;
          memcpy(local_730 + 4,local_40,local_80 << 4);
          local_738 = (long)(int)local_740 + 0x10 + local_738;
          local_80 = local_80 + 2;
          iVar1 = CMtrace_val[3];
          if (*(long *)(*local_10 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              pFVar7 = *(FILE **)(*local_10 + 0x120);
              _Var2 = getpid();
              in_stack_fffffffffffff800 = (CManager)(long)_Var2;
              pVar4 = pthread_self();
              fprintf(pFVar7,"P%lxT%lx - ",in_stack_fffffffffffff800,pVar4);
              trace_type = (CMTraceType)((ulong)pFVar7 >> 0x20);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_770);
              fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_770.tv_sec,
                      local_770.tv_nsec);
            }
            fprintf(*(FILE **)(*local_10 + 0x120),
                    "Writing %lu vectors, total %zu bytes (including attrs) in writev\n",local_80,
                    local_738);
          }
          fflush(*(FILE **)(*local_10 + 0x120));
        }
        iVar1 = INT_CMwrite_raw(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                                (FFSEncodeVector)in_stack_fffffffffffff7e0,
                                (long)in_stack_fffffffffffff7d8,(size_t)in_stack_fffffffffffff7d0,
                                in_stack_fffffffffffff7c8,(int)in_stack_fffffffffffff800);
        local_78 = (long)iVar1;
        if (local_730 != local_728) {
          INT_CMfree((void *)0x127503);
        }
        if (local_78 == 0) {
          iVar1 = CMtrace_val[7];
          if (*(long *)(*local_10 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              pFVar7 = *(FILE **)(*local_10 + 0x120);
              _Var2 = getpid();
              lVar6 = (long)_Var2;
              pVar4 = pthread_self();
              fprintf(pFVar7,"P%lxT%lx - ",lVar6,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_780);
              fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_780.tv_sec,
                      local_780.tv_nsec);
            }
            fprintf(*(FILE **)(*local_10 + 0x120),
                    "Calling connection (write failed) failed with dereference %p\n",local_10);
          }
          fflush(*(FILE **)(*local_10 + 0x120));
          INT_CMConnection_failed(in_stack_fffffffffffff810);
          iVar1 = CMtrace_val[3];
          if (*(long *)(*local_10 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              pFVar7 = *(FILE **)(*local_10 + 0x120);
              _Var2 = getpid();
              lVar6 = (long)_Var2;
              pVar4 = pthread_self();
              fprintf(pFVar7,"P%lxT%lx - ",lVar6,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_790);
              fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_790.tv_sec,
                      local_790.tv_nsec);
            }
            fprintf(*(FILE **)(*local_10 + 0x120),"Writev failed\n");
          }
          fflush(*(FILE **)(*local_10 + 0x120));
          return 0;
        }
      }
      if (in_stack_00000008 != (size_t *)0x0) {
        *in_stack_00000008 = local_70;
      }
      iVar1 = CMtrace_val[3];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)(*local_10 + 0x120);
          _Var2 = getpid();
          lVar6 = (long)_Var2;
          pVar4 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",lVar6,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_7a0);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_7a0.tv_sec,local_7a0.tv_nsec);
        }
        fprintf(*(FILE **)(*local_10 + 0x120),"Writev success\n");
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      return 1;
    }
    if (*(long *)(*in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
      if (iVar1 == 0) goto LAB_00126965;
    }
    else if (CMtrace_val[4] == 0) goto LAB_00126965;
    if (CMtrace_PID != 0) {
      pFVar7 = *(FILE **)(*local_10 + 0x120);
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_c0);
      fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_c0.tv_sec,local_c0.tv_nsec);
    }
    fprintf(*(FILE **)(*local_10 + 0x120),"Not writing data to failed connection\n");
LAB_00126965:
    fflush(*(FILE **)(*local_10 + 0x120));
    return 0;
  }
  if (*(long *)(*in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_fffffffffffff800,trace_type);
    if (iVar1 == 0) goto LAB_00126812;
  }
  else if (CMtrace_val[4] == 0) goto LAB_00126812;
  if (CMtrace_PID != 0) {
    pFVar7 = *(FILE **)(*local_10 + 0x120);
    _Var2 = getpid();
    pVar4 = pthread_self();
    fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar4);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_b0);
    fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_b0.tv_sec,local_b0.tv_nsec);
  }
  fprintf(*(FILE **)(*local_10 + 0x120),"Not writing data to closed connection\n");
LAB_00126812:
  fflush(*(FILE **)(*local_10 + 0x120));
  return 0;
}

Assistant:

extern int
 internal_write_event(CMConnection conn, CMFormat format, void *remote_path_id,
		      int path_len, event_item *event, attr_list attrs, size_t *event_len_p)
 {
     FFSEncodeVector vec;
     struct FFSEncodeVec preencoded_vec[2];
     size_t data_length = 0, actual;
     long vec_count = 0;
     int attr_len = 0;
     int do_write = 1;
     void *encoded_attrs = NULL;
     int attrs_present = 0;
     CManager cm = conn->cm;

     /* ensure conn is open */
     if (conn->closed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to closed connection\n");
	 return 0;
     }
     if (conn->failed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to failed connection\n");
	 return 0;
     }
     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     if (format->registration_pending) {
	 CMcomplete_format_registration(format, 1);
     }
     if (format->fmformat == NULL) {
	 printf("Format registration has failed for format \"%s\" - write aborted\n",
		format->format_name);
	 return 0;
     }
     CMformat_preload(conn, format);

     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - Writing EVENT record %p of type %s\n", event,
		name_of_FMformat(format->fmformat));
	 if (attrs != NULL) {
	     fprintf(cm->CMTrace_file, "CM - write attributes are:");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 } else {
	     fprintf(cm->CMTrace_file, "CM - write attrs NULL\n");
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents ", name_of_FMformat(format->fmformat));
	 if (event->decoded_event) {
	     fprintf(cm->CMTrace_file, "DECODED are:\n  ");
	     r = FMfdump_data(cm->CMTrace_file, format->fmformat, event->decoded_event,
			      dump_char_limit);
	 } else {
	     fprintf(cm->CMTrace_file, "ENCODED are:\n  ");
	     r = FMfdump_encoded_data(cm->CMTrace_file, format->fmformat,
				      event->encoded_event, dump_char_limit);
	 }	    
	 if (!r && !warned) {
	     fprintf(cm->CMTrace_file, "\n\n  ****  Warning **** CM record dump truncated\n");
	     fprintf(cm->CMTrace_file, "  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }

     if (!event->encoded_event) {
	 /* encode data with CM context */
	 vec = FFSencode_vector(conn->io_out_buffer,
				format->fmformat, event->decoded_event);
	 while(vec[vec_count].iov_base != NULL) {
	     data_length += vec[vec_count].iov_len;
	     vec_count++;
	 }
     } else {
	 vec = &preencoded_vec[0];
	 preencoded_vec[0].iov_base = event->encoded_event;
	 preencoded_vec[0].iov_len = event->event_len;
	 preencoded_vec[1].iov_base = NULL;
	 preencoded_vec[1].iov_len = 0;
	 vec_count = 1;
	 data_length = event->event_len;
     }
     if (attrs != NULL) {
	 attrs_present++;
	 encoded_attrs = encode_attr_for_xmit(attrs, conn->attr_encode_buffer,
					      &attr_len);
	 attr_len = (attr_len +7) & -8;  /* round up to even 8 */
     }
     CMtrace_out(conn->cm, CMDataVerbose, "CM - Total write size is %zd bytes data + %d bytes attrs\n", data_length, attr_len);
     if (cm_write_hook != NULL) {
	 do_write = cm_write_hook(data_length);
     }
     if (do_write) {
	 struct FFSEncodeVec static_vec[100];
	 FFSEncodeVector tmp_vec = &static_vec[0];
	 size_t byte_count = data_length;/* sum lengths */
	 int header[4] = {0x434d4C00, 0, 0, 0};  /* CML\0 in first entry */
	 if (vec_count >= sizeof(static_vec)/ sizeof(static_vec[0])) {
	     tmp_vec = INT_CMmalloc((vec_count+3) * sizeof(*tmp_vec));
	 }
	 header[1] = (int)data_length;
	 if (path_len != 4) {
	     header[0] = 0x434d4700;
	     header[3] = (path_len + 7) & -8;
	 } else {
	     header[0] = 0x434d4C00;  /* 4 byte chan ID */
	     header[3] = *((int*)remote_path_id);
	 }
	 if (attrs == NULL) {
	     FFSEncodeVector assign_vec = tmp_vec;
	     header[2] = 0;
	     if (path_len != 4) {
		 tmp_vec[1].iov_base = remote_path_id;
		 tmp_vec[1].iov_len = (path_len + 7) & -8;
		 byte_count += tmp_vec[1].iov_len;
		 assign_vec++;
	     }
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     memcpy(&assign_vec[1], vec, sizeof(*tmp_vec) * vec_count);
	     vec_count++;
	     byte_count += sizeof(header);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes in writev\n", 
			 vec_count, byte_count);
	 } else {
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     tmp_vec[1].iov_base = encoded_attrs;
	     header[2] = attr_len;
	     tmp_vec[1].iov_len = attr_len;
	     memcpy(&tmp_vec[2], vec, sizeof(*tmp_vec) * vec_count);
	     byte_count += sizeof(header) + header[2];
	     vec_count += 2;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes (including attrs) in writev\n", 
			 vec_count, byte_count);
	 }
	 actual = INT_CMwrite_raw(conn, tmp_vec, vec, vec_count, byte_count, attrs,
				     vec == &preencoded_vec[0]);
	 if (tmp_vec != &static_vec[0]) {
	     INT_CMfree(tmp_vec);
	 }
	 if (actual <= 0) {
	     /* fail */
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection (write failed) failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writev failed\n");
	     return 0;
	 }
     }
     if (event_len_p) *event_len_p = data_length;
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Writev success\n");
     return 1;
 }